

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t push_data_ready(archive_read *a,rar5 *rar,uint8_t *buf,size_t size,int64_t offset)

{
  data_ready *pdVar1;
  char *fmt;
  wchar_t wVar2;
  
  wVar2 = L'\0';
  if (rar->skip_mode != L'\0') {
    return L'\0';
  }
  if ((rar->file).last_size + (rar->file).last_offset == offset) {
    if ((rar->cstate).dready[0].used == '\0') {
      pdVar1 = (rar->cstate).dready;
    }
    else {
      if ((rar->cstate).dready[1].used != '\0') {
        fmt = "Error: premature end of data_ready stack";
        goto LAB_0014d08a;
      }
      pdVar1 = (rar->cstate).dready + 1;
    }
    pdVar1->used = '\x01';
    pdVar1->buf = buf;
    pdVar1->size = size;
    pdVar1->offset = offset;
    (rar->file).last_offset = offset;
    (rar->file).last_size = size;
    update_crc(rar,buf,size);
  }
  else {
    fmt = "Sanity check error: output stream is not continuous";
LAB_0014d08a:
    archive_set_error(&a->archive,0x16,fmt);
    wVar2 = L'\xffffffe2';
  }
  return wVar2;
}

Assistant:

static int push_data_ready(struct archive_read* a, struct rar5* rar,
    const uint8_t* buf, size_t size, int64_t offset)
{
	int i;

	/* Don't push if we're in skip mode. This is needed because solid
	 * streams need full processing even if we're skipping data. After
	 * fully processing the stream, we need to discard the generated bytes,
	 * because we're interested only in the side effect: building up the
	 * internal window circular buffer. This window buffer will be used
	 * later during unpacking of requested data. */
	if(rar->skip_mode)
		return ARCHIVE_OK;

	/* Sanity check. */
	if(offset != rar->file.last_offset + rar->file.last_size) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Sanity check error: output stream is not continuous");
		return ARCHIVE_FATAL;
	}

	for(i = 0; i < rar5_countof(rar->cstate.dready); i++) {
		struct data_ready* d = &rar->cstate.dready[i];
		if(!d->used) {
			d->used = 1;
			d->buf = buf;
			d->size = size;
			d->offset = offset;

			/* These fields are used only in sanity checking. */
			rar->file.last_offset = offset;
			rar->file.last_size = size;

			/* Calculate the checksum of this new block before
			 * submitting data to libarchive's engine. */
			update_crc(rar, d->buf, d->size);

			return ARCHIVE_OK;
		}
	}

	/* Program counter will reach this code if the `rar->cstate.data_ready`
	 * stack will be filled up so that no new entries will be allowed. The
	 * code shouldn't allow such situation to occur. So we treat this case
	 * as an internal error. */

	archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
	    "Error: premature end of data_ready stack");
	return ARCHIVE_FATAL;
}